

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Profile.cpp
# Opt level: O1

void __thiscall Profile::__displayBacktraceDynMap(Profile *this)

{
  _Hash_node_base *p_Var1;
  DynFuncCall *dfc;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  long *plVar3;
  ostream *poVar4;
  
  if ((DebugFlag) && (bVar2 = isCurrentDebugType("info"), bVar2)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"__displayBacktraceDynMap",0x18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    plVar3 = (long *)std::ostream::operator<<(&std::cerr,0x116);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  for (p_Var1 = (this->__backtraceDynamicMap)._M_h._M_before_begin._M_nxt;
      p_Var1 != (_Hash_node_base *)0x0; p_Var1 = p_Var1->_M_nxt) {
    dfc = (DynFuncCall *)p_Var1[2]._M_nxt;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1[3]._M_nxt;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    if ((DebugFlag == true) && (bVar2 = isCurrentDebugType("info"), bVar2)) {
      poVar4 = operator<<((ostream *)&std::cerr,dfc);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  return;
}

Assistant:

void Profile::__displayBacktraceDynMap(){
    DEBUG("info",cerr << __FUNCTION__ << ":" << __LINE__<< endl;);
    for (auto it = __backtraceDynamicMap.begin(); it != __backtraceDynamicMap.end(); it++){
        shared_ptr<DynFuncCall>value = it->second;
        DEBUG("info",cerr << *value << endl;);
    }
}